

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

size_t __thiscall avro::GenericRecord::fieldIndex(GenericRecord *this,string *name)

{
  char cVar1;
  Exception *this_00;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = (**(code **)(**(long **)this + 0x48))();
  if (cVar1 != '\0') {
    return 0;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::operator+(&local_38,"Invalid field name: ",name);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t fieldIndex(const std::string& name) const { 
        size_t index = 0;
        if (!schema()->nameIndex(name, index)) {
            throw Exception("Invalid field name: " + name);
        }
        return index;
    }